

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O3

void __thiscall
cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse>::add_variable
          (BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse> *this,uint *v,double *bias)

{
  double dVar1;
  iterator iVar2;
  Scalar *pSVar3;
  uint local_1c;
  
  _add_new_label(this,*v);
  dVar1 = *bias;
  local_1c = *v;
  iVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->_label_to_idx)._M_h,&local_1c);
  if (iVar2.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_long>,_false>._M_cur !=
      (__node_type *)0x0) {
    pSVar3 = Eigen::SparseMatrix<double,_1,_int>::coeffRef
                       (&this->_quadmat,
                        *(Index *)((long)iVar2.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_long>,_false>
                                         ._M_cur + 0x10),(this->_quadmat).m_outerSize + -1);
    *pSVar3 = dVar1 + *pSVar3;
    return;
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void add_variable( const IndexType &v, const FloatType &bias ) {
      // add new label if not exist
      _add_new_label( v );
      _mat( v ) += bias;
    }